

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phf.cc
# Opt level: O0

void PHF::compact(phf *phf)

{
  uint32_t *puVar1;
  anon_enum_32 aVar2;
  void *tmp;
  size_t size;
  phf *phf_local;
  
  if (phf->g_op == PHF_G_UINT32_MOD_R || phf->g_op == PHF_G_UINT32_BAND_R) {
    if (phf->d_max < 0x100) {
      phf_memmove<unsigned_char,unsigned_int>((uchar *)phf->g,phf->g,phf->r);
      aVar2 = PHF_G_UINT8_MOD_R;
      if ((phf->nodiv & 1U) != 0) {
        aVar2 = PHF_G_UINT8_BAND_R;
      }
      phf->g_op = aVar2;
      tmp = (void *)0x1;
    }
    else {
      if (0xffff < phf->d_max) {
        return;
      }
      phf_memmove<unsigned_short,unsigned_int>((unsigned_short *)phf->g,phf->g,phf->r);
      aVar2 = PHF_G_UINT16_MOD_R;
      if ((phf->nodiv & 1U) != 0) {
        aVar2 = PHF_G_UINT16_BAND_R;
      }
      phf->g_op = aVar2;
      tmp = (void *)0x2;
    }
    puVar1 = (uint32_t *)realloc(phf->g,phf->r * (long)tmp);
    if (puVar1 != (uint32_t *)0x0) {
      phf->g = puVar1;
    }
  }
  return;
}

Assistant:

PHF_PUBLIC void PHF::compact(struct phf *phf) {
	size_t size = 0;
	void *tmp;

	switch (phf->g_op) {
	case phf::PHF_G_UINT32_MOD_R:
	case phf::PHF_G_UINT32_BAND_R:
		break;
	default:
		return; /* already compacted */
	}

	if (phf->d_max <= 255) {
		phf_memmove(reinterpret_cast<uint8_t *>(phf->g), reinterpret_cast<uint32_t *>(phf->g), phf->r);
		phf->g_op = (phf->nodiv)? phf::PHF_G_UINT8_BAND_R : phf::PHF_G_UINT8_MOD_R;
		size = sizeof (uint8_t);
	} else if (phf->d_max <= 65535) {
		phf_memmove(reinterpret_cast<uint16_t *>(phf->g), reinterpret_cast<uint32_t *>(phf->g), phf->r);
		phf->g_op = (phf->nodiv)? phf::PHF_G_UINT16_BAND_R : phf::PHF_G_UINT16_MOD_R;
		size = sizeof (uint16_t);
	} else {
		return; /* nothing to compact */
	}

	/* simply keep old array if realloc fails */
	if ((tmp = realloc(phf->g, phf->r * size)))
		phf->g = static_cast<uint32_t *>(tmp);
}